

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O1

void __thiscall XmlOutput::addAttribute(XmlOutput *this,QString *attribute,QString *value)

{
  int iVar1;
  int *piVar2;
  QTextStream *pQVar3;
  long in_FS_OFFSET;
  QArrayData *local_80;
  undefined8 *local_78;
  QString local_68;
  QString local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->currentState < Attribute) {
    local_50.d.d._0_4_ = 2;
    local_50.d.d._4_4_ = 0;
    local_50.d.ptr._0_4_ = 0;
    local_50.d._12_8_ = 0;
    local_50.d.size._4_4_ = 0;
    local_38 = "default";
    if ((this->tagStack).super_QList<QString>.d.size == 0) {
      QString::toLatin1_helper((QString *)&local_80);
      if (local_78 == (undefined8 *)0x0) {
        local_78 = &QByteArray::_empty;
      }
      QMessageLogger::debug
                ((char *)&local_50,"<%s>: Cannot add attribute (%s) since tag\'s not open","Root",
                 local_78);
      if (local_80 == (QArrayData *)0x0) goto LAB_002601ad;
      LOCK();
      (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = (local_80->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
    }
    else {
      QList<QString>::end(&(this->tagStack).super_QList<QString>);
      QString::toLatin1_helper((QString *)&local_68);
      if (local_68.d.ptr == (char16_t *)0x0) {
        local_68.d.ptr = (char16_t *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&local_80);
      if (local_78 == (undefined8 *)0x0) {
        local_78 = &QByteArray::_empty;
      }
      QMessageLogger::debug
                ((char *)&local_50,"<%s>: Cannot add attribute (%s) since tag\'s not open",
                 local_68.d.ptr,local_78);
      if (local_80 != (QArrayData *)0x0) {
        LOCK();
        (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_80,1,0x10);
        }
      }
      if (&(local_68.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_002601ad;
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      local_80 = &(local_68.d.d)->super_QArrayData;
    }
    if (iVar1 == 0) {
      QArrayData::deallocate(local_80,1,0x10);
    }
  }
  else {
    if (this->format == NewLine) {
      Qt::endl(this->xmlFile);
    }
    pQVar3 = (QTextStream *)QTextStream::operator<<(this->xmlFile,(QString *)&this->currentIndent);
    doConversion(&local_50,this,attribute);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_50);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"=\"");
    doConversion(&local_68,this,value);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_68);
    QTextStream::operator<<(pQVar3,"\"");
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_50.d.d._4_4_,local_50.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,local_50.d.d._0_4_),2,0x10)
        ;
      }
    }
  }
LAB_002601ad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::addAttribute(const QString &attribute, const QString &value)
{
     switch(currentState) {
        case Bare:
        case Tag:
            //warn_msg(WarnLogic, "<%s>: Cannot add attribute since tags not open", tagStack.last().toLatin1().constData());
            qDebug("<%s>: Cannot add attribute (%s) since tag's not open",
                   (tagStack.size() ? tagStack.last().toLatin1().constData() : "Root"),
                   attribute.toLatin1().constData());
            return;
        case Attribute:
            break;
    }
    if (format == NewLine)
        xmlFile << Qt::endl;
    xmlFile << currentIndent << doConversion(attribute) << "=\"" << doConversion(value) << "\"";
}